

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.h
# Opt level: O1

void __thiscall
btTriangleIndexVertexArray::addIndexedMesh
          (btTriangleIndexVertexArray *this,btIndexedMesh *mesh,PHY_ScalarType indexType)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  btIndexedMesh *pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uchar *puVar11;
  uchar *puVar12;
  PHY_ScalarType PVar13;
  int iVar14;
  undefined4 uVar15;
  btIndexedMesh *pbVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  
  iVar3 = (this->m_indexedMeshes).m_size;
  iVar4 = (this->m_indexedMeshes).m_capacity;
  if (iVar3 == iVar4) {
    iVar19 = 1;
    if (iVar3 != 0) {
      iVar19 = iVar3 * 2;
    }
    if (iVar4 < iVar19) {
      if (iVar19 == 0) {
        pbVar16 = (btIndexedMesh *)0x0;
      }
      else {
        pbVar16 = (btIndexedMesh *)btAlignedAllocInternal((long)iVar19 * 0x30,0x10);
      }
      lVar17 = (long)(this->m_indexedMeshes).m_size;
      if (0 < lVar17) {
        lVar18 = 0;
        do {
          pbVar5 = (this->m_indexedMeshes).m_data;
          puVar1 = (undefined8 *)((long)&pbVar5->m_numTriangles + lVar18);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pbVar5->m_triangleIndexStride + lVar18);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pbVar5->m_vertexStride + lVar18);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pbVar16->m_vertexStride + lVar18);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)&pbVar16->m_triangleIndexStride + lVar18);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          puVar1 = (undefined8 *)((long)&pbVar16->m_numTriangles + lVar18);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          lVar18 = lVar18 + 0x30;
        } while (lVar17 * 0x30 != lVar18);
      }
      pbVar5 = (this->m_indexedMeshes).m_data;
      if (pbVar5 != (btIndexedMesh *)0x0) {
        if ((this->m_indexedMeshes).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar5);
        }
        (this->m_indexedMeshes).m_data = (btIndexedMesh *)0x0;
      }
      (this->m_indexedMeshes).m_ownsMemory = true;
      (this->m_indexedMeshes).m_data = pbVar16;
      (this->m_indexedMeshes).m_capacity = iVar19;
    }
  }
  pbVar16 = (this->m_indexedMeshes).m_data;
  iVar3 = (this->m_indexedMeshes).m_size;
  iVar14 = mesh->m_numTriangles;
  uVar15 = *(undefined4 *)&mesh->field_0x4;
  puVar11 = mesh->m_triangleIndexBase;
  iVar4 = mesh->m_triangleIndexStride;
  iVar19 = mesh->m_numVertices;
  puVar12 = mesh->m_vertexBase;
  PVar13 = mesh->m_indexType;
  uVar6 = *(undefined8 *)&mesh->m_vertexType;
  pbVar5 = pbVar16 + iVar3;
  pbVar5->m_vertexStride = mesh->m_vertexStride;
  pbVar5->m_indexType = PVar13;
  *(undefined8 *)(&pbVar5->m_vertexStride + 2) = uVar6;
  pbVar5 = pbVar16 + iVar3;
  pbVar5->m_triangleIndexStride = iVar4;
  pbVar5->m_numVertices = iVar19;
  *(uchar **)(&pbVar5->m_triangleIndexStride + 2) = puVar12;
  pbVar16 = pbVar16 + iVar3;
  pbVar16->m_numTriangles = iVar14;
  *(undefined4 *)&pbVar16->field_0x4 = uVar15;
  pbVar16->m_triangleIndexBase = puVar11;
  iVar3 = (this->m_indexedMeshes).m_size;
  (this->m_indexedMeshes).m_size = iVar3 + 1;
  (this->m_indexedMeshes).m_data[iVar3].m_indexType = indexType;
  return;
}

Assistant:

void	addIndexedMesh(const btIndexedMesh& mesh, PHY_ScalarType indexType = PHY_INTEGER)
	{
		m_indexedMeshes.push_back(mesh);
		m_indexedMeshes[m_indexedMeshes.size()-1].m_indexType = indexType;
	}